

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

void helper_neon_qzip16_arm(void *vd,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = *vd;
  uVar2 = *(ulong *)((long)vd + 8);
  uVar3 = *vm;
  uVar4 = *(ulong *)((long)vm + 8);
  *(ulong *)vm = (ulong)((uint)uVar4 & 0xffff0000) << 0x20 |
                 (ulong)((uint)uVar2 & 0xffff0000) << 0x10 | uVar2 & 0xffff |
                 (ulong)((uint)uVar4 << 0x10);
  *(ulong *)((long)vm + 8) =
       uVar4 & 0xffff000000000000 | uVar2 >> 0x10 & 0xffff00000000 | uVar2 >> 0x20 & 0xffff |
       (ulong)((uint)(uVar4 >> 0x10) & 0xffff0000);
  *(ulong *)vd = (ulong)((uint)uVar3 & 0xffff0000) << 0x20 |
                 (ulong)((uint)uVar1 & 0xffff0000) << 0x10 | uVar1 & 0xffff |
                 (ulong)((uint)uVar3 << 0x10);
  *(ulong *)((long)vd + 8) =
       uVar3 & 0xffff000000000000 | uVar1 >> 0x10 & 0xffff00000000 | uVar1 >> 0x20 & 0xffff |
       (ulong)((uint)(uVar3 >> 0x10) & 0xffff0000);
  return;
}

Assistant:

void HELPER(neon_qzip16)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd0 = rd[0], zd1 = rd[1];
    uint64_t zm0 = rm[0], zm1 = rm[1];

    uint64_t d0 = ELEM(zd0, 0, 16) | (ELEM(zm0, 0, 16) << 16)
        | (ELEM(zd0, 1, 16) << 32) | (ELEM(zm0, 1, 16) << 48);
    uint64_t d1 = ELEM(zd0, 2, 16) | (ELEM(zm0, 2, 16) << 16)
        | (ELEM(zd0, 3, 16) << 32) | (ELEM(zm0, 3, 16) << 48);
    uint64_t m0 = ELEM(zd1, 0, 16) | (ELEM(zm1, 0, 16) << 16)
        | (ELEM(zd1, 1, 16) << 32) | (ELEM(zm1, 1, 16) << 48);
    uint64_t m1 = ELEM(zd1, 2, 16) | (ELEM(zm1, 2, 16) << 16)
        | (ELEM(zd1, 3, 16) << 32) | (ELEM(zm1, 3, 16) << 48);

    rm[0] = m0;
    rm[1] = m1;
    rd[0] = d0;
    rd[1] = d1;
}